

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

void save_load(gdmf *d,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  uint32_t uVar2;
  vw *all;
  undefined4 uVar3;
  ostream *poVar4;
  size_t sVar5;
  weight *data;
  size_t sVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint32_t *puVar7;
  ulong uVar8;
  bool bVar9;
  uint64_t i;
  int local_1e0;
  undefined4 local_1dc;
  io_buf *local_1d8;
  ulong local_1d0;
  parameters *local_1c8;
  gdmf *local_1c0;
  uint32_t stride;
  ostream local_1a8;
  
  local_1dc = (undefined4)CONCAT71(in_register_00000009,text);
  all = d->all;
  local_1d0 = (ulong)all->num_bits;
  local_1e0 = (int)CONCAT71(in_register_00000011,read);
  local_1d8 = model_file;
  local_1c0 = d;
  if ((local_1e0 != 0) && (initialize_regressor(all), all->random_weights == true)) {
    bVar1 = (all->weights).sparse;
    puVar7 = &(all->weights).dense_weights._stride_shift;
    if (bVar1 != false) {
      puVar7 = &(all->weights).sparse_weights._stride_shift;
    }
    stride = 1 << ((byte)*puVar7 & 0x1f);
    if (bVar1 == true) {
      sparse_parameters::set_default<unsigned_int,set_rand_wrapper<sparse_parameters>>
                (&(all->weights).sparse_weights,&stride);
    }
    else {
      dense_parameters::set_default<unsigned_int,set_rand_wrapper<dense_parameters>>
                (&(all->weights).dense_weights,&stride);
    }
  }
  uVar3 = local_1dc;
  if ((local_1d8->files)._end != (local_1d8->files)._begin) {
    i = 0;
    local_1c8 = &all->weights;
    bVar1 = (bool)(char)local_1e0;
    do {
      while( true ) {
        uVar2 = local_1c0->rank;
        std::__cxx11::stringstream::stringstream((stringstream *)&stride);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(poVar4," ");
        sVar5 = bin_text_read_write_fixed
                          (local_1d8,(char *)&i,8,"",bVar1,(stringstream *)&stride,SUB41(uVar3,0));
        if (sVar5 == 0) {
          sVar5 = 0;
        }
        else {
          data = parameters::strided_index(local_1c8,i);
          uVar8 = (ulong)(uVar2 * 2 | 1);
          while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
            poVar4 = std::ostream::_M_insert<void_const*>(&local_1a8);
            std::operator<<(poVar4," ");
            sVar6 = bin_text_read_write_fixed
                              (local_1d8,(char *)data,4,"",bVar1,(stringstream *)&stride,
                               SUB41(uVar3,0));
            sVar5 = sVar5 + sVar6;
            data = data + 1;
          }
        }
        if ((char)local_1dc != '\0') {
          std::operator<<(&local_1a8,"\n");
          sVar6 = bin_text_read_write_fixed
                            (local_1d8,(char *)0x0,0,"",bVar1,(stringstream *)&stride,true);
          sVar5 = sVar5 + sVar6;
        }
        if ((char)local_1e0 == '\0') break;
        std::__cxx11::stringstream::~stringstream((stringstream *)&stride);
        if (sVar5 == 0) {
          return;
        }
      }
      i = i + 1;
      std::__cxx11::stringstream::~stringstream((stringstream *)&stride);
    } while (i >> ((byte)local_1d0 & 0x3f) == 0);
  }
  return;
}

Assistant:

void save_load(gdmf& d, io_buf& model_file, bool read, bool text)
{
  vw& all = *d.all;
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    if (all.random_weights)
    {
      uint32_t stride = all.weights.stride();
      if (all.weights.sparse)
        all.weights.sparse_weights.set_default<uint32_t, set_rand_wrapper<sparse_parameters> >(stride);
      else
        all.weights.dense_weights.set_default<uint32_t, set_rand_wrapper<dense_parameters> >(stride);
    }
  }

  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    size_t brw = 1;
    do
    {
      brw = 0;
      size_t K = d.rank * 2 + 1;
      stringstream msg;
      msg << i << " ";
      brw += bin_text_read_write_fixed(model_file, (char*)&i, sizeof(i), "", read, msg, text);
      if (brw != 0)
      {
        weight* w_i = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight* v = w_i + k;
          msg << v << " ";
          brw += bin_text_read_write_fixed(model_file, (char*)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }

      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}